

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMappingSparseMapped.cpp
# Opt level: O1

void __thiscall
RewardModelMappingSparseMapped::RewardModelMappingSparseMapped
          (RewardModelMappingSparseMapped *this,size_t nrS,size_t nrJA,string *s_str,string *ja_str)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_RewardModel)._m_nrStates = nrS;
  (this->super_RewardModel)._m_nrJointActions = nrJA;
  (this->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
  _vptr_QTableInterface = (_func_int **)&PTR_Get_005d02a8;
  (this->_m_s_str)._M_dataplus._M_p = (pointer)&(this->_m_s_str).field_2;
  (this->_m_s_str)._M_string_length = 0;
  (this->_m_s_str).field_2._M_local_buf[0] = '\0';
  (this->_m_ja_str)._M_dataplus._M_p = (pointer)&(this->_m_ja_str).field_2;
  (this->_m_ja_str)._M_string_length = 0;
  (this->_m_ja_str).field_2._M_local_buf[0] = '\0';
  (this->_m_R).size1_ = nrS;
  (this->_m_R).size2_ = nrJA;
  p_Var1 = &(this->_m_R).data_.
            super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)
   &(this->_m_R).data_.
    super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->_m_R).data_.
    super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)
   ((long)&(this->_m_R).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->_m_R).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->_m_R).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->_m_R).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->_m_R).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = (_Base_ptr)0x0;
  (this->_m_R).data_.
  super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(_Rb_tree_header **)
   ((long)&(this->_m_R).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->_m_R).data_.
           super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->_m_R).data_.
  super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)&this->_m_s_str);
  std::__cxx11::string::_M_assign((string *)&this->_m_ja_str);
  return;
}

Assistant:

RewardModelMappingSparseMapped::RewardModelMappingSparseMapped(size_t nrS, size_t nrJA,
                                                   const string &s_str,
                                                   const string &ja_str) : 
    RewardModel(nrS, nrJA),
    _m_R(nrS,nrJA)
{
    _m_s_str = s_str;
    _m_ja_str = ja_str;
}